

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,string *filename,string *depName,Indent indent)

{
  bool bVar1;
  ostream *poVar2;
  cmMakefile *this_00;
  string *psVar3;
  WrapQuotes wrapQuotes;
  undefined1 auVar4 [16];
  string_view str;
  string local_158;
  string local_138;
  string local_118;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [16];
  string local_e0;
  int local_bc;
  reference local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_81;
  string local_80;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  cmScriptGeneratorIndent local_44;
  string *psStack_40;
  Indent indent2;
  string *depName_local;
  string *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *evaluatedRPaths_local;
  string *config_local;
  ostream *os_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  Indent indent_local;
  
  wrapQuotes = (WrapQuotes)filename;
  if (((this->NoInstallRPath & 1U) == 0) || ((this->NoInstallName & 1U) == 0)) {
    local_44.Level = indent.Level;
    psStack_40 = depName;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(evaluatedRPaths);
    if ((bVar1) && ((this->NoInstallName & 1U) != 0)) {
      local_48 = (int)cmScriptGeneratorIndent::Next(&local_44,2);
      local_4c = indent.Level;
      local_44 = (cmScriptGeneratorIndent)local_48;
      poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar2 = std::operator<<(poVar2,"if(");
      poVar2 = std::operator<<(poVar2,this->RPathPrefix);
      poVar2 = std::operator<<(poVar2,"_");
      poVar2 = std::operator<<(poVar2,(string *)filename);
      std::operator<<(poVar2,")\n");
    }
    local_50 = local_44.Level;
    poVar2 = ::operator<<(os,local_44);
    poVar2 = std::operator<<(poVar2,"set(");
    poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
    std::operator<<(poVar2,"_rpath_args)\n");
    if ((this->NoInstallRPath & 1U) == 0) {
      local_54 = local_44.Level;
      poVar2 = ::operator<<(os,local_44);
      poVar2 = std::operator<<(poVar2,"foreach(");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath IN LISTS ");
      poVar2 = std::operator<<(poVar2,this->RPathPrefix);
      poVar2 = std::operator<<(poVar2,'_');
      poVar2 = std::operator<<(poVar2,(string *)filename);
      poVar2 = std::operator<<(poVar2,")\n");
      local_58 = (int)cmScriptGeneratorIndent::Next(&local_44,2);
      poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)local_58);
      poVar2 = std::operator<<(poVar2,"list(APPEND ");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath_args -delete_rpath \"${");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath}\")\n");
      local_5c = local_44.Level;
      poVar2 = ::operator<<(poVar2,local_44);
      std::operator<<(poVar2,"endforeach()\n");
    }
    local_60 = local_44.Level;
    poVar2 = ::operator<<(os,local_44);
    poVar2 = std::operator<<(poVar2,"execute_process(COMMAND \"");
    this_00 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_INSTALL_NAME_TOOL",&local_81);
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_80);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" ${");
    poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
    std::operator<<(poVar2,"_rpath_args}\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if ((this->NoInstallRPath & 1U) == 0) {
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(evaluatedRPaths);
      rpath = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(evaluatedRPaths);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&rpath);
        if (!bVar1) break;
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        local_bc = local_44.Level;
        poVar2 = ::operator<<(os,local_44);
        poVar2 = std::operator<<(poVar2,"  -add_rpath ");
        auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
        str._M_len = auVar4._8_8_;
        str._M_str = (char *)0x0;
        local_f0 = auVar4;
        cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_e0,auVar4._0_8_,str,wrapQuotes);
        poVar2 = std::operator<<(poVar2,(string *)&local_e0);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_e0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    if ((this->NoInstallName & 1U) == 0) {
      local_f4 = local_44.Level;
      poVar2 = ::operator<<(os,local_44);
      poVar2 = std::operator<<(poVar2,"  -id \"${");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_install_name_dir}");
      poVar2 = std::operator<<(poVar2,(string *)psStack_40);
      std::operator<<(poVar2,"\"\n");
    }
    local_f8 = local_44.Level;
    poVar2 = ::operator<<(os,local_44);
    poVar2 = std::operator<<(poVar2,"  \"");
    GetDestination(&local_158,this,config);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_138,&local_158);
    cmInstallGenerator::GetDestDirPath(&local_118,&local_138);
    poVar2 = std::operator<<(poVar2,(string *)&local_118);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = std::operator<<(poVar2,(string *)psStack_40);
    std::operator<<(poVar2,"\")\n");
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(evaluatedRPaths);
    if ((bVar1) && ((this->NoInstallName & 1U) != 0)) {
      poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar2,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, const std::string& filename,
  const std::string& depName, Indent indent)
{
  if (!(this->NoInstallRPath && this->NoInstallName)) {
    auto indent2 = indent;
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      indent2 = indent2.Next();
      os << indent << "if(" << this->RPathPrefix << "_" << filename << ")\n";
    }
    os << indent2 << "set(" << this->TmpVarPrefix << "_rpath_args)\n";
    if (!this->NoInstallRPath) {
      os << indent2 << "foreach(" << this->TmpVarPrefix << "_rpath IN LISTS "
         << this->RPathPrefix << '_' << filename << ")\n"
         << indent2.Next() << "list(APPEND " << this->TmpVarPrefix
         << "_rpath_args -delete_rpath \"${" << this->TmpVarPrefix
         << "_rpath}\")\n"
         << indent2 << "endforeach()\n";
    }
    os << indent2 << "execute_process(COMMAND \""
       << this->LocalGenerator->GetMakefile()->GetSafeDefinition(
            "CMAKE_INSTALL_NAME_TOOL")
       << "\" ${" << this->TmpVarPrefix << "_rpath_args}\n";
    if (!this->NoInstallRPath) {
      for (auto const& rpath : evaluatedRPaths) {
        os << indent2 << "  -add_rpath "
           << cmOutputConverter::EscapeForCMake(rpath) << "\n";
      }
    }
    if (!this->NoInstallName) {
      os << indent2 << "  -id \"${" << this->TmpVarPrefix
         << "_install_name_dir}" << depName << "\"\n";
    }
    os << indent2 << "  \""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n";
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      os << indent << "endif()\n";
    }
  }
}